

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<void_*> * __thiscall
kj::_::NullableValue<void_*>::operator=(NullableValue<void_*> *this,NullableValue<void_*> *other)

{
  void **params;
  NullableValue<void_*> *other_local;
  NullableValue<void_*> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<void*>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<void*>(&(other->field_1).value);
      ctor<void*,void*>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }